

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O0

Reader __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::getUnqualifiedName(CapnpcCapnpMain *this,Schema schema)

{
  Reader brand;
  StringPtr SVar1;
  bool bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  Iterator IVar5;
  Reader RVar6;
  Fault local_1e0;
  Fault f;
  Reader nested;
  undefined1 local_198 [8];
  Iterator __end2;
  undefined1 local_178 [8];
  Iterator __begin2;
  Reader local_138;
  Reader *local_108;
  Reader *__range2;
  Reader local_f8;
  Schema local_b8;
  Schema parent;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnpc_capnp_c__:109:5)>
  _kjContext109;
  anon_class_8_1_a879b908 _kjContextFunc109;
  Reader proto;
  CapnpcCapnpMain *this_local;
  Schema schema_local;
  
  this_local = (CapnpcCapnpMain *)schema.raw;
  Schema::getProto((Reader *)&_kjContextFunc109,(Schema *)&this_local);
  _kjContext109.func = &_kjContextFunc109;
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnpc-capnp.c++:109:5)>
  ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnpc_capnp_c__:109:5)>
                 *)&parent,(anon_class_8_1_a879b908 *)&_kjContext109.func);
  uVar3 = capnp::schema::Node::Reader::getScopeId((Reader *)&_kjContextFunc109);
  local_f8._reader.dataSize = 0;
  local_f8._reader.pointerCount = 0;
  local_f8._reader._38_2_ = 0;
  local_f8._reader.nestingLimit = 0;
  local_f8._reader._44_4_ = 0;
  local_f8._reader.data = (void *)0x0;
  local_f8._reader.pointers = (WirePointer *)0x0;
  local_f8._reader.segment = (SegmentReader *)0x0;
  local_f8._reader.capTable = (CapTableReader *)0x0;
  capnp::schema::Brand::Reader::Reader(&local_f8);
  Schema::Schema((Schema *)&__range2);
  brand._reader.capTable = local_f8._reader.capTable;
  brand._reader.segment = local_f8._reader.segment;
  brand._reader.data = local_f8._reader.data;
  brand._reader.pointers = local_f8._reader.pointers;
  brand._reader.dataSize = local_f8._reader.dataSize;
  brand._reader.pointerCount = local_f8._reader.pointerCount;
  brand._reader._38_2_ = local_f8._reader._38_2_;
  brand._reader.nestingLimit = local_f8._reader.nestingLimit;
  brand._reader._44_4_ = local_f8._reader._44_4_;
  local_b8 = SchemaLoader::get(&this->schemaLoader,uVar3,brand,(Schema)__range2);
  Schema::getProto((Reader *)&__begin2.index,&local_b8);
  capnp::schema::Node::Reader::getNestedNodes(&local_138,(Reader *)&__begin2.index);
  local_108 = &local_138;
  IVar5 = List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader::begin(local_108);
  __end2._8_8_ = IVar5.container;
  __begin2.container._0_4_ = IVar5.index;
  local_178 = (undefined1  [8])__end2._8_8_;
  IVar5 = List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader::end(local_108);
  local_198 = (undefined1  [8])IVar5.container;
  __end2.container._0_4_ = IVar5.index;
  while( true ) {
    bVar2 = _::
            IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
            ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
                          *)local_178,
                         (IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
                          *)local_198);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[73]>
                (&local_1e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnpc-capnp.c++"
                 ,0x74,FAILED,(char *)0x0,
                 "\"A schema Node\'s supposed scope did not contain the node as a NestedNode.\"",
                 (char (*) [73])
                 "A schema Node\'s supposed scope did not contain the node as a NestedNode.");
      kj::_::Debug::Fault::fatal(&local_1e0);
    }
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
    ::operator*((Reader *)&f,
                (IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
                 *)local_178);
    uVar3 = capnp::schema::Node::NestedNode::Reader::getId((Reader *)&f);
    uVar4 = capnp::schema::Node::Reader::getId((Reader *)&_kjContextFunc109);
    if (uVar3 == uVar4) break;
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
                  *)local_178);
  }
  RVar6 = capnp::schema::Node::NestedNode::Reader::getName((Reader *)&f);
  schema_local.raw = RVar6.super_StringPtr.content.ptr;
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnpc-capnp.c++:109:5)>
  ::~ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnpc_capnp_c__:109:5)>
                  *)&parent);
  SVar1.content.size_ = RVar6.super_StringPtr.content.size_;
  SVar1.content.ptr = (char *)schema_local.raw;
  return (StringPtr)(StringPtr)SVar1.content;
}

Assistant:

Text::Reader getUnqualifiedName(Schema schema) {
    auto proto = schema.getProto();
    KJ_CONTEXT(proto.getDisplayName());
    auto parent = schemaLoader.get(proto.getScopeId());
    for (auto nested: parent.getProto().getNestedNodes()) {
      if (nested.getId() == proto.getId()) {
        return nested.getName();
      }
    }
    KJ_FAIL_REQUIRE("A schema Node's supposed scope did not contain the node as a NestedNode.");
    return "(?)";
  }